

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O0

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::
start(AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this)

{
  thread *in_RDI;
  type *in_stack_00000008;
  thread *in_stack_00000010;
  thread *in_stack_ffffffffffffffd8;
  
  std::thread::
  thread<aeron::concurrent::AgentRunner<aeron::ClientConductor,aeron::concurrent::SleepingIdleStrategy>::start()::_lambda()_1_,,void>
            (in_stack_00000010,in_stack_00000008);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::thread::~thread((thread *)0x1e2964);
  return;
}

Assistant:

inline void start()
    {
        m_thread = std::thread([&]()
        {
#if defined(AERON_COMPILER_MSVC)
#elif defined(Darwin)
            pthread_setname_np(m_name.c_str());
#else
            pthread_setname_np(pthread_self(), m_name.c_str());
#endif
            run();
        });
    }